

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObject.h
# Opt level: O3

shared_ptr<chrono::ChMarker> __thiscall
chrono::
ChContainerSearchFromName<std::shared_ptr<chrono::ChMarker>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChMarker>*,std::vector<std::shared_ptr<chrono::ChMarker>,std::allocator<std::shared_ptr<chrono::ChMarker>>>>>
          (chrono *this,char *m_name,
          __normal_iterator<std::shared_ptr<chrono::ChMarker>_*,_std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
          from,__normal_iterator<std::shared_ptr<chrono::ChMarker>_*,_std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
               to)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __normal_iterator<std::shared_ptr<chrono::ChMarker>_*,_std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
  _Var4;
  shared_ptr<chrono::ChMarker> sVar5;
  
  _Var4._M_current = from._M_current;
  if (from._M_current != to._M_current) {
    do {
      peVar1 = ((_Var4._M_current)->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      iVar3 = strcmp(m_name,(peVar1->super_ChObj).m_name._M_dataplus._M_p);
      from._M_current = (shared_ptr<chrono::ChMarker> *)extraout_RDX;
      if (iVar3 == 0) {
        *(element_type **)this = peVar1;
        p_Var2 = ((_Var4._M_current)->
                 super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
        ;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        goto LAB_0050c164;
      }
      _Var4._M_current = _Var4._M_current + 1;
    } while (_Var4._M_current != to._M_current);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_0050c164:
  sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from._M_current;
  sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChMarker>)
         sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T ChContainerSearchFromName(const char* m_name, Iterator from, Iterator to) {
    Iterator iter = from;
    while (iter != to) {
        if (!strcmp(m_name, (*iter)->GetName()))
            return (*iter);
        iter++;
    }
    return T(0);
}